

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::IsClippedEx(ImRect *bb,ImGuiID id,bool clip_even_when_logged)

{
  ImGuiContext *pIVar1;
  bool bVar2;
  byte in_DL;
  ImGuiID in_ESI;
  ImRect *in_RDI;
  ImGuiWindow *window;
  ImGuiContext *g;
  bool local_1;
  
  pIVar1 = GImGui;
  bVar2 = ImRect::Overlaps(in_RDI,&GImGui->CurrentWindow->ClipRect);
  if (((bVar2) || ((in_ESI != 0 && ((in_ESI == pIVar1->ActiveId || (in_ESI == pIVar1->NavId)))))) ||
     (((in_DL & 1) == 0 && ((pIVar1->LogEnabled & 1U) != 0)))) {
    local_1 = false;
  }
  else {
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool ImGui::IsClippedEx(const ImRect& bb, ImGuiID id, bool clip_even_when_logged)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (!bb.Overlaps(window->ClipRect))
        if (id == 0 || (id != g.ActiveId && id != g.NavId))
            if (clip_even_when_logged || !g.LogEnabled)
                return true;
    return false;
}